

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zz_mul.c
# Opt level: O2

void zzDiv(word *q,word *r,word *a,size_t n,word *b,size_t m,void *stack)

{
  ulong *puVar1;
  word *b_00;
  ulong uVar2;
  long lVar3;
  int iVar4;
  word wVar5;
  size_t shift;
  size_t sVar6;
  word *b_01;
  long lVar7;
  word *a_00;
  
  iVar4 = wwCmp2(a,n,b,m);
  if (iVar4 < 0) {
    wwSetZero(q,(n - m) + 1);
    stack = a;
  }
  else {
    if (m == 1) {
      wVar5 = zzDivW(q,a,n,*b);
      *r = wVar5;
      return;
    }
    b_00 = (word *)((long)stack + n * 8 + 8);
    lVar3 = m * 8 + n * 8;
    b_01 = (word *)((long)stack + lVar3 + 8);
    wwCopy((word *)stack,a,n);
    b_00[-1] = 0;
    wwCopy(b_00,b,m);
    shift = u64CLZ(b[m - 1]);
    wwShHi((word *)stack,n + 1,shift);
    wwShHi(b_00,m,shift);
    a_00 = (word *)((long)stack + m * 8 + n * 8 + -8);
    for (sVar6 = n; lVar7 = sVar6 - m, m <= sVar6; sVar6 = sVar6 - 1) {
      puVar1 = (ulong *)((long)stack + sVar6 * 8);
      uVar2 = *(ulong *)((long)stack + m * 8 + n * 8);
      wVar5 = 0xffffffffffffffff;
      if (*puVar1 != uVar2) {
        wVar5 = __udivti3(puVar1[-1],*puVar1,uVar2,0);
      }
      q[lVar7] = wVar5;
      wwCopy(b_01,a_00,2);
      wVar5 = zzMulW(b_01,b_01,2,q[lVar7]);
      while( true ) {
        *(word *)((long)stack + lVar3 + 0x18) = wVar5;
        iVar4 = wwCmp2(b_01,3,puVar1 + -2,3);
        if (iVar4 < 1) break;
        q[lVar7] = q[lVar7] - 1;
        wVar5 = zzSub2(b_01,a_00,2);
        wVar5 = *(long *)((long)stack + lVar3 + 0x18) - wVar5;
      }
      wVar5 = zzSubMulW(puVar1 + -m,b_00,m,q[lVar7]);
      uVar2 = *puVar1;
      *puVar1 = uVar2 - wVar5;
      if (CARRY8(uVar2 - wVar5,wVar5)) {
        q[lVar7] = q[lVar7] - 1;
        wVar5 = zzAdd2(puVar1 + -m,b_00,m);
        *puVar1 = *puVar1 + wVar5;
      }
    }
    wwShLo((word *)stack,n + 1,shift);
  }
  wwCopy(r,(word *)stack,m);
  return;
}

Assistant:

void zzDiv(word q[], word r[], const word a[], size_t n, const word b[],
	size_t m, void* stack)
{
	register dword qhat;
	register size_t shift;
	register word t;
	size_t i;
	// переменные в stack
	word* divident;		/*< нормализованное делимое (n + 1 слово) */
	word* divisor;		/*< нормализованный делитель (m слов) */
	word* mul;			/*< вспомогательное произведение (3 слова) */
	// pre
	ASSERT(n >= m);
	ASSERT(wwIsValid(a, n) && wwIsValid(b, m));
	ASSERT(m > 0 && b[m - 1] > 0);
	ASSERT(wwIsDisjoint2(q, n + 1 - m, r, m));
	ASSERT(a == r || wwIsDisjoint2(a, n, r, m));
	// a < b?
	if (wwCmp2(a, n, b, m) < 0)
	{
		// q <- 0, r <- a
		wwSetZero(q, n - m + 1);
		wwCopy(r, a, m);
		return;
	}
	// делим на одноразрядное число?
	if (m == 1)
	{
		r[0] = zzDivW(q, a, n, b[0]);
		return;
	}
	// резервируем переменные в stack
	divident = (word*)stack;
	divisor = divident + n + 1;
	mul = divisor + m;
	stack = mul + 3;
	// divident <- a
	wwCopy(divident, a, n);
	divident[n] = 0;
	// divisor <- b
	wwCopy(divisor, b, m);
	// нормализация
	shift = wordCLZ(b[m - 1]);
	wwShHi(divident, n + 1, shift);
	wwShHi(divisor, m, shift);
	// цикл по разрядам делимого
	for (i = n; i >= m; --i)
	{
		// вычислить пробное частное
		if (divident[i] == divisor[m - 1])
			q[i - m] = WORD_MAX;
		else
		{
			qhat = divident[i];
			qhat <<= B_PER_W;
			qhat |= divident[i - 1];
			qhat /= divisor[m - 1];
			q[i - m] = (word)qhat;
		}
		// уточнить пробное частное
		wwCopy(mul, divisor + m - 2, 2);
		mul[2] = zzMulW(mul, mul, 2, q[i - m]);
		while (wwCmp2(mul, 3, divident + i - 2, 3) > 0)
		{
			q[i - m]--;
			mul[2] -= zzSub2(mul, divisor + m - 2, 2);
		}
		// учесть пробное частное
		t = zzSubMulW(divident + i - m, divisor, m, q[i - m]);
		divident[i] -= t;
		if (divident[i] > (word)~t)
		{
			// окончательно подправить пробное частное
			q[i - m]--;
			// корректирующее сложение
			divident[i] += zzAdd2(divident + i - m, divisor, m);
		}
	}
	// денормализация
	wwShLo(divident, n + 1, shift);
	// сохранить остаток
	wwCopy(r, divident, m);
	// очистить регистровые переменные
	t = 0, shift = 0, qhat = 0;
}